

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_typed_buffer_header(void *buf,size_t bufsiz,flatbuffers_thash_t thash)

{
  int iVar1;
  
  iVar1 = 5;
  if ((((ulong)buf & 3) == 0) &&
     (iVar1 = 6 - (uint)(bufsiz >> 3 < 0x1fffffff), bufsiz >> 3 < 0x1fffffff)) {
    if (bufsiz < 8) {
      iVar1 = 1;
    }
    else {
      if ((thash == 0) || (*(flatbuffers_thash_t *)((long)buf + 4) == thash)) {
        return 0;
      }
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_typed_buffer_header(const void *buf, size_t bufsiz, flatbuffers_thash_t thash)
{
    thash_t id, id2;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);
    /*
     * Even if we specify no fid, the user might later. Therefore
     * require space for it. Not all buffer generators will take this
     * into account, so it is possible to fail an otherwise valid buffer
     * - but such buffers aren't safe.
     */
    verify(bufsiz >= offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);
    if (thash != 0) {
        id2 = thash;
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    return flatcc_verify_ok;
}